

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O1

float ** Llb_ManComputeQuant(Llb_Mtr_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  float **ppfVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  ppfVar4 = (float **)Extra_ArrayAlloc(p->nCols,p->nCols,4);
  iVar3 = p->nCols;
  if (0 < (long)iVar3) {
    lVar5 = 0;
    do {
      ppfVar4[lVar5][lVar5] = 0.0;
      lVar5 = lVar5 + 1;
    } while (iVar3 != lVar5);
  }
  if (2 < iVar3) {
    uVar2 = iVar3 - 1;
    uVar7 = 2;
    uVar8 = 1;
    do {
      uVar1 = uVar8 + 1;
      uVar6 = uVar7;
      if ((long)uVar1 < (long)(int)uVar2) {
        do {
          iVar3 = Llb_ManComputeCommonQuant(p,(int)uVar8,(int)uVar6);
          ppfVar4[uVar6][uVar8] = (float)iVar3;
          ppfVar4[uVar8][uVar6] = (float)iVar3;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar7 = uVar7 + 1;
      uVar8 = uVar1;
    } while (uVar1 != uVar2);
  }
  return ppfVar4;
}

Assistant:

float ** Llb_ManComputeQuant( Llb_Mtr_t * p )
{
    float ** pCosts;
    int i, k;
    // alloc and clean
    pCosts = (float **)Extra_ArrayAlloc( p->nCols, p->nCols, sizeof(float) );
    for ( i = 0; i < p->nCols; i++ )
    for ( k = 0; k < p->nCols; k++ )
        pCosts[i][i] = 0.0;
    // fill up
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
        pCosts[i][k] = pCosts[k][i] = Llb_ManComputeCommonQuant( p, i, k );
    return pCosts;
}